

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O1

void __thiscall llm_tokenizer_rwkv::~llm_tokenizer_rwkv(llm_tokenizer_rwkv *this)

{
  (this->super_llm_tokenizer)._vptr_llm_tokenizer = (_func_int **)&PTR__llm_tokenizer_rwkv_00287388;
  llama_vocab::std::
  _Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
  ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
               *)&this->token_matcher);
  operator_delete(this,0x40);
  return;
}

Assistant:

llm_tokenizer_rwkv(const llama_vocab & vocab) {
        // RWKV supports arbitrary byte tokens, but the vocab struct only supports string tokens.
        // For now, we decode the vocab here into the lookup we'll use for tokenization.

        // build trie
        for (uint32_t id = 0; id < vocab.n_tokens(); ++id) {
            const auto & data = vocab.get_token_data(id);
            const auto text = llama_unescape_rwkv_token(data.text);
            token_matcher.insert((const char *) text.data(), text.size(), id);
        }
    }